

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O2

Status __thiscall
ot::commissioner::persistent_storage::Registry::GetNetworkByName
          (Registry *this,string *aName,Network *aRet)

{
  Status SVar1;
  Network nwk;
  undefined1 auStack_78 [96];
  
  Network::Network((Network *)auStack_78);
  std::__cxx11::string::_M_assign((string *)(auStack_78 + 8));
  SVar1 = LookupOne(this,(Network *)auStack_78,aRet);
  Network::~Network((Network *)auStack_78);
  return SVar1;
}

Assistant:

Registry::Status Registry::GetNetworkByName(const std::string &aName, Network &aRet)
{
    Network nwk{};
    nwk.mName = aName;
    return LookupOne(nwk, aRet);
}